

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O3

bool anon_unknown.dwarf_1605013::ArchToolsetStrategyHelper
               (optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out,Value *value,
               cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  _Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> _Var3;
  String local_50;
  
  if (value == (Value *)0x0) {
    if ((out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload
        .super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged != true)
    {
      return true;
    }
    (out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged = false;
    return true;
  }
  bVar1 = Json::Value::isString(value);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      _Var3._M_payload = (_Storage<cmCMakePresetsGraph::ArchToolsetStrategy,_true>)0x0;
      _Var3._M_engaged = true;
      _Var3._5_3_ = 0;
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0) goto LAB_003e0bc9;
      _Var3._M_payload = (_Storage<cmCMakePresetsGraph::ArchToolsetStrategy,_true>)0x1;
      _Var3._M_engaged = true;
      _Var3._5_3_ = 0;
    }
    (out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> = _Var3;
    bVar1 = true;
  }
  else {
LAB_003e0bc9:
    cmCMakePresetsErrors::INVALID_PRESET(value,state);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ArchToolsetStrategyHelper(cm::optional<ArchToolsetStrategy>& out,
                               const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "set") {
    out = ArchToolsetStrategy::Set;
    return true;
  }

  if (value->asString() == "external") {
    out = ArchToolsetStrategy::External;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}